

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O3

void __thiscall license::FullLicenseInfo::printAsIni(FullLicenseInfo *this,ostream *a_ostream)

{
  int iVar1;
  string product;
  StreamWriter sw;
  string result;
  string local_e8;
  string local_c8;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_a8;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.m_pData = (char *)0x0;
  local_a8.m_uDataLen = 0;
  local_a8.m_pFileComment = (char *)0x0;
  local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.m_strings;
  local_a8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node._M_size._0_7_ = 0;
  local_a8._95_4_ = 0;
  local_a8.m_bSpaces = true;
  local_a8.m_nOrder = 0;
  local_38 = 0;
  local_30[0] = 0;
  local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.m_strings.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.m_strings.
       super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_40 = local_30;
  trim_copy(&local_c8,&this->product);
  toupper_copy(&local_e8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)&PTR__OutputWriter_006246b8;
  local_c8._M_string_length = (size_type)a_ostream;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
            (&local_a8,local_e8._M_dataplus._M_p,"license_version",0x6e,(char *)0x0,false,false);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
            (&local_a8,local_e8._M_dataplus._M_p,"license_signature",
             (this->license_signature)._M_dataplus._M_p,(char *)0x0,false,true);
  if (this->has_client_sig == true) {
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
              (&local_a8,local_e8._M_dataplus._M_p,"client_signature",
               (this->client_signature)._M_dataplus._M_p,(char *)0x0,false,true);
  }
  if (this->has_versions == true) {
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
              (&local_a8,local_e8._M_dataplus._M_p,"from_sw_version",(ulong)this->from_sw_version,
               (char *)0x0,false,false);
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::SetLongValue
              (&local_a8,local_e8._M_dataplus._M_p,"to_sw_version",(ulong)this->to_sw_version,
               (char *)0x0,false,false);
  }
  iVar1 = std::__cxx11::string::compare((char *)&this->from_date);
  if (iVar1 != 0) {
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
              (&local_a8,local_e8._M_dataplus._M_p,"from_date",(this->from_date)._M_dataplus._M_p,
               (char *)0x0,false,true);
  }
  iVar1 = std::__cxx11::string::compare((char *)&this->to_date);
  if (iVar1 != 0) {
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
              (&local_a8,local_e8._M_dataplus._M_p,"to_date",(this->to_date)._M_dataplus._M_p,
               (char *)0x0,false,true);
  }
  if ((this->extra_data)._M_string_length != 0) {
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
              (&local_a8,local_e8._M_dataplus._M_p,"extra_data",(this->extra_data)._M_dataplus._M_p,
               (char *)0x0,false,true);
  }
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
            (&local_a8,(OutputWriter *)&local_c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl(&local_a8);
  return;
}

Assistant:

void FullLicenseInfo::printAsIni(ostream & a_ostream) const {
	CSimpleIniA ini;
	string result;
	string product = toupper_copy(trim_copy(this->product));
	CSimpleIniA::StreamWriter sw(a_ostream);
	ini.SetLongValue(product.c_str(), "license_version",
	PROJECT_INT_VERSION);
	ini.SetValue(product.c_str(), "license_signature",
			this->license_signature.c_str());
	if (has_client_sig) {
		ini.SetValue(product.c_str(), "client_signature",
				this->client_signature.c_str());
	}
	if (has_versions) {
		ini.SetLongValue(product.c_str(), "from_sw_version", from_sw_version);
		ini.SetLongValue(product.c_str(), "to_sw_version", to_sw_version);
	}

	if (this->from_date != UNUSED_TIME) {
		ini.SetValue(product.c_str(), "from_date", from_date.c_str());
	}
	if (this->to_date != UNUSED_TIME) {
		ini.SetValue(product.c_str(), "to_date", to_date.c_str());
	}
	if (this->extra_data.length() > 0) {
		ini.SetValue(product.c_str(), "extra_data", this->extra_data.c_str());
	}
	ini.Save(sw);
}